

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::UnderscoresToCamelCase(string *name,bool cap_first_letter)

{
  ulong uVar1;
  char *pcVar2;
  byte in_DL;
  ulong in_RSI;
  string *in_RDI;
  int i;
  string *result;
  int local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  std::__cxx11::string::string((string *)in_RDI);
  for (local_18 = 0; uVar1 = std::__cxx11::string::size(), (ulong)(long)local_18 < uVar1;
      local_18 = local_18 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
    if ((*pcVar2 < 'a') ||
       (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), 'z' < *pcVar2)) {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
      if ((*pcVar2 < 'A') ||
         (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), 'Z' < *pcVar2)) {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
        if (('/' < *pcVar2) &&
           (pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI), *pcVar2 < ':')) {
          pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
          std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
        }
        local_11 = 1;
      }
      else {
        if ((local_18 == 0) && (local_11 == 0)) {
          pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
          std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2 + ' ');
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
          std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
        }
        local_11 = 0;
      }
    }
    else {
      if (local_11 == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
        std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
        std::__cxx11::string::operator+=((string *)in_RDI,*pcVar2 + -0x20);
      }
      local_11 = 0;
    }
  }
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
  if (*pcVar2 == '#') {
    std::__cxx11::string::operator+=((string *)in_RDI,'_');
  }
  return in_RDI;
}

Assistant:

std::string UnderscoresToCamelCase(const string& name, bool cap_first_letter) {
  std::string result;
  for (int i = 0; i < name.size(); i++) {
    if ('a' <= name[i] && name[i] <= 'z') {
      if (cap_first_letter) {
        result += name[i] + ('A' - 'a');
      } else {
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('A' <= name[i] && name[i] <= 'Z') {
      if (i == 0 && !cap_first_letter) {
        // Force first letter to lower-case unless explicitly told to
        // capitalize it.
        result += name[i] + ('a' - 'A');
      } else {
        // Capital letters after the first are left as-is.
        result += name[i];
      }
      cap_first_letter = false;
    } else if ('0' <= name[i] && name[i] <= '9') {
      result += name[i];
      cap_first_letter = true;
    } else {
      cap_first_letter = true;
    }
  }
  // Add a trailing "_" if the name should be altered.
  if (name[name.size() - 1] == '#') {
    result += '_';
  }
  return result;
}